

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_multiple_data_objects.c
# Opt level: O0

int64_t file_skip(archive *a,void *client_data,int64_t request)

{
  long in_RSI;
  read_file_data *mine;
  undefined8 local_8;
  
  if (*(char *)(in_RSI + 0x1c) == '\0') {
    local_8 = 0;
  }
  else {
    local_8 = file_skip_lseek(a,client_data,request);
  }
  return local_8;
}

Assistant:

static int64_t
file_skip(struct archive *a, void *data, int64_t request)
{
  struct mydata *mydata = (struct mydata *)data;
  int64_t result = lseek(mydata->fd, SEEK_CUR, request);
  if (result >= 0)
    return result;
  archive_set_error(a, errno, "Error seeking in '%s'", mydata->filename);
  return -1;
}